

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckListUsage(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  uint code;
  bool bVar2;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    code = 0;
    bVar2 = true;
    if (node != (Node *)0x0) {
      pDVar1 = node->tag;
      if (pDVar1 != (Dict *)0x0) {
        bVar2 = pDVar1->id != TidyTag_OL;
        code = 0x2be;
        if (bVar2) {
          code = 0;
        }
        if (bVar2 && pDVar1 != (Dict *)0x0) {
          bVar2 = pDVar1->id != TidyTag_UL;
          code = 0x2bd;
          if (bVar2) {
            code = 0;
          }
        }
      }
    }
    if (bVar2) {
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_LI)) {
        if (((node->parent == (Node *)0x0) || (pDVar1 = node->parent->tag, pDVar1 == (Dict *)0x0))
           || ((pDVar1->id != TidyTag_OL && ((pDVar1 == (Dict *)0x0 || (pDVar1->id != TidyTag_UL))))
              )) goto LAB_00153b4a;
        if (((pDVar1 != (Dict *)0x0) && (node->implicit != no)) &&
           ((pDVar1->id == TidyTag_OL || ((pDVar1 != (Dict *)0x0 && (pDVar1->id == TidyTag_UL))))))
        {
          if (pDVar1 != (Dict *)0x0) {
            prvTidyReportAccessError(doc,node,(pDVar1->id != TidyTag_UL) + 0x2bd);
            return;
          }
          prvTidyReportAccessError(doc,node,0x2be);
          return;
        }
      }
    }
    else {
      if (((node->content == (Node *)0x0) || (pDVar1 = node->content->tag, pDVar1 == (Dict *)0x0))
         || (pDVar1->id != TidyTag_LI)) {
        prvTidyReport(doc,(Node *)0x0,node,code);
        return;
      }
      if (node->implicit != no) {
LAB_00153b4a:
        prvTidyReportAccessError(doc,node,0x2bf);
        return;
      }
    }
  }
  return;
}

Assistant:

static void CheckListUsage( TidyDocImpl* doc, Node* node )
{
    int msgcode = 0;

    if (!Level2_Enabled( doc ))
        return;

    if ( nodeIsOL(node) )
        msgcode = LIST_USAGE_INVALID_OL;
    else if ( nodeIsUL(node) )
        msgcode = LIST_USAGE_INVALID_UL;

    if ( msgcode )
    {
       /*
       ** Check that OL/UL
       ** a) has LI child,
       ** b) was not added by Tidy parser
       ** IFF OL/UL node is implicit
       */
       if ( !nodeIsLI(node->content) ) {
            TY_(ReportAccessError)( doc, node, msgcode );
       } else if ( node->implicit ) {  /* if a tidy added node */
            TY_(ReportAccessError)( doc, node, LIST_USAGE_INVALID_LI );
       }
    }
    else if ( nodeIsLI(node) )
    {
        /* Check that LI parent 
        ** a) exists,
        ** b) is either OL or UL
        ** IFF the LI parent was added by Tidy
        ** ie, if it is marked 'implicit', then
        ** emit warnings LIST_USAGE_INVALID_UL or 
        ** warning LIST_USAGE_INVALID_OL tests 
        */
        if ( node->parent == NULL ||
             ( !nodeIsOL(node->parent) && !nodeIsUL(node->parent) ) )
        {
            TY_(ReportAccessError)( doc, node, LIST_USAGE_INVALID_LI );
        } else if ( node->implicit && node->parent &&
                    ( nodeIsOL(node->parent) || nodeIsUL(node->parent) ) ) {
            /* if tidy added LI node, then */
            msgcode = nodeIsUL(node->parent) ?
                LIST_USAGE_INVALID_UL : LIST_USAGE_INVALID_OL;
            TY_(ReportAccessError)( doc, node, msgcode );
        }
    }
}